

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Transformation * __thiscall
TransformParser::parse(Transformation *__return_storage_ptr__,TransformParser *this)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  char *pcVar4;
  bool bVar5;
  size_t sVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  StringView local_a8;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  string local_50;
  
  __return_storage_ptr__->a = 1.0;
  __return_storage_ptr__->b = 0.0;
  __return_storage_ptr__->c = 0.0;
  __return_storage_ptr__->d = 1.0;
  __return_storage_ptr__->e = 0.0;
  __return_storage_ptr__->f = 0.0;
  sVar6 = (this->super_Parser).s.size;
  if (sVar6 != 0) {
    pbVar3 = (byte *)(this->super_Parser).s.s;
    do {
      sVar6 = sVar6 - 1;
      local_a8.s = (this->super_Parser).s.s;
      local_a8.size = (this->super_Parser).s.size;
      bVar1 = *pbVar3;
      (this->super_Parser).s.s = (char *)(pbVar3 + 1);
      (this->super_Parser).s.size = sVar6;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        (this->super_Parser).s.s = local_a8.s;
        (this->super_Parser).s.size = local_a8.size;
        break;
      }
      pbVar3 = pbVar3 + 1;
    } while (sVar6 != 0);
  }
  sVar6 = (this->super_Parser).s.size;
  do {
    if (sVar6 == 0) {
      return __return_storage_ptr__;
    }
    bVar5 = Parser::parse(&this->super_Parser,"matrix");
    if (bVar5) {
      sVar6 = (this->super_Parser).s.size;
      if (sVar6 != 0) {
        pbVar3 = (byte *)(this->super_Parser).s.s;
        do {
          sVar6 = sVar6 - 1;
          pcVar4 = (this->super_Parser).s.s;
          local_a8.size = (this->super_Parser).s.size;
          bVar1 = *pbVar3;
          (this->super_Parser).s.s = (char *)(pbVar3 + 1);
          (this->super_Parser).s.size = sVar6;
          if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
            (this->super_Parser).s.s = pcVar4;
            (this->super_Parser).s.size = local_a8.size;
            break;
          }
          pbVar3 = pbVar3 + 1;
        } while (sVar6 != 0);
      }
      local_a8.s = "(";
      local_a8.size = StringView::strlen((StringView *)"(",(char *)0x0);
      Parser::expect(&this->super_Parser,&local_a8);
      sVar6 = (this->super_Parser).s.size;
      if (sVar6 != 0) {
        pbVar3 = (byte *)(this->super_Parser).s.s;
        do {
          sVar6 = sVar6 - 1;
          local_a8.s = (this->super_Parser).s.s;
          local_a8.size = (this->super_Parser).s.size;
          bVar1 = *pbVar3;
          (this->super_Parser).s.s = (char *)(pbVar3 + 1);
          (this->super_Parser).s.size = sVar6;
          if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
            (this->super_Parser).s.s = local_a8.s;
            (this->super_Parser).s.size = local_a8.size;
            break;
          }
          pbVar3 = pbVar3 + 1;
        } while (sVar6 != 0);
      }
      local_8c = Parser::parse_number(&this->super_Parser);
      sVar6 = (this->super_Parser).s.size;
      if (sVar6 != 0) {
        pbVar3 = (byte *)(this->super_Parser).s.s;
        do {
          sVar6 = sVar6 - 1;
          local_a8.s = (this->super_Parser).s.s;
          local_a8.size = (this->super_Parser).s.size;
          bVar1 = *pbVar3;
          (this->super_Parser).s.s = (char *)(pbVar3 + 1);
          (this->super_Parser).s.size = sVar6;
          if ((bVar1 != 0x2c) && ((bVar1 < 0x21 & (byte)(0x100002600 >> (bVar1 & 0x3f))) == 0)) {
            (this->super_Parser).s.s = local_a8.s;
            (this->super_Parser).s.size = local_a8.size;
            break;
          }
          pbVar3 = pbVar3 + 1;
        } while (sVar6 != 0);
      }
      local_78 = Parser::parse_number(&this->super_Parser);
      sVar6 = (this->super_Parser).s.size;
      if (sVar6 != 0) {
        pbVar3 = (byte *)(this->super_Parser).s.s;
        do {
          sVar6 = sVar6 - 1;
          local_a8.s = (this->super_Parser).s.s;
          local_a8.size = (this->super_Parser).s.size;
          bVar1 = *pbVar3;
          (this->super_Parser).s.s = (char *)(pbVar3 + 1);
          (this->super_Parser).s.size = sVar6;
          if ((bVar1 != 0x2c) && ((bVar1 < 0x21 & (byte)(0x100002600 >> (bVar1 & 0x3f))) == 0)) {
            (this->super_Parser).s.s = local_a8.s;
            (this->super_Parser).s.size = local_a8.size;
            break;
          }
          pbVar3 = pbVar3 + 1;
        } while (sVar6 != 0);
      }
      local_7c = Parser::parse_number(&this->super_Parser);
      sVar6 = (this->super_Parser).s.size;
      if (sVar6 != 0) {
        pbVar3 = (byte *)(this->super_Parser).s.s;
        do {
          sVar6 = sVar6 - 1;
          local_a8.s = (this->super_Parser).s.s;
          local_a8.size = (this->super_Parser).s.size;
          bVar1 = *pbVar3;
          (this->super_Parser).s.s = (char *)(pbVar3 + 1);
          (this->super_Parser).s.size = sVar6;
          if ((bVar1 != 0x2c) && ((bVar1 < 0x21 & (byte)(0x100002600 >> (bVar1 & 0x3f))) == 0)) {
            (this->super_Parser).s.s = local_a8.s;
            (this->super_Parser).s.size = local_a8.size;
            break;
          }
          pbVar3 = pbVar3 + 1;
        } while (sVar6 != 0);
      }
      local_80 = Parser::parse_number(&this->super_Parser);
      sVar6 = (this->super_Parser).s.size;
      if (sVar6 != 0) {
        pbVar3 = (byte *)(this->super_Parser).s.s;
        do {
          sVar6 = sVar6 - 1;
          local_a8.s = (this->super_Parser).s.s;
          local_a8.size = (this->super_Parser).s.size;
          bVar1 = *pbVar3;
          (this->super_Parser).s.s = (char *)(pbVar3 + 1);
          (this->super_Parser).s.size = sVar6;
          if ((bVar1 != 0x2c) && ((bVar1 < 0x21 & (byte)(0x100002600 >> (bVar1 & 0x3f))) == 0)) {
            (this->super_Parser).s.s = local_a8.s;
            (this->super_Parser).s.size = local_a8.size;
            break;
          }
          pbVar3 = pbVar3 + 1;
        } while (sVar6 != 0);
      }
      local_84 = Parser::parse_number(&this->super_Parser);
      sVar6 = (this->super_Parser).s.size;
      if (sVar6 != 0) {
        pbVar3 = (byte *)(this->super_Parser).s.s;
        do {
          sVar6 = sVar6 - 1;
          local_a8.s = (this->super_Parser).s.s;
          local_a8.size = (this->super_Parser).s.size;
          bVar1 = *pbVar3;
          (this->super_Parser).s.s = (char *)(pbVar3 + 1);
          (this->super_Parser).s.size = sVar6;
          if ((bVar1 != 0x2c) && ((bVar1 < 0x21 & (byte)(0x100002600 >> (bVar1 & 0x3f))) == 0)) {
            (this->super_Parser).s.s = local_a8.s;
            (this->super_Parser).s.size = local_a8.size;
            break;
          }
          pbVar3 = pbVar3 + 1;
        } while (sVar6 != 0);
      }
      local_88 = Parser::parse_number(&this->super_Parser);
      sVar6 = (this->super_Parser).s.size;
      if (sVar6 != 0) {
        pbVar3 = (byte *)(this->super_Parser).s.s;
        do {
          sVar6 = sVar6 - 1;
          pcVar4 = (this->super_Parser).s.s;
          local_a8.size = (this->super_Parser).s.size;
          bVar1 = *pbVar3;
          (this->super_Parser).s.s = (char *)(pbVar3 + 1);
          (this->super_Parser).s.size = sVar6;
          if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
            (this->super_Parser).s.s = pcVar4;
            (this->super_Parser).s.size = local_a8.size;
            break;
          }
          pbVar3 = pbVar3 + 1;
        } while (sVar6 != 0);
      }
      local_a8.s = ")";
      local_a8.size = StringView::strlen((StringView *)0x111d87,(char *)0x0);
      Parser::expect(&this->super_Parser,&local_a8);
      fVar8 = __return_storage_ptr__->c;
      fVar10 = __return_storage_ptr__->a;
      fVar12 = __return_storage_ptr__->b;
      fVar14 = __return_storage_ptr__->d;
      fVar7 = fVar10 * local_84 + fVar8 * local_88 + __return_storage_ptr__->e;
      fVar9 = fVar12 * local_84 + local_88 * fVar14 + __return_storage_ptr__->f;
      __return_storage_ptr__->a = fVar10 * local_8c + local_78 * fVar8;
      __return_storage_ptr__->b = local_8c * fVar12 + local_78 * fVar14;
      __return_storage_ptr__->c = fVar10 * local_7c + local_80 * fVar8;
      __return_storage_ptr__->d = local_7c * fVar12 + local_80 * fVar14;
LAB_00108539:
      __return_storage_ptr__->e = fVar7;
      __return_storage_ptr__->f = fVar9;
    }
    else {
      bVar5 = Parser::parse(&this->super_Parser,"translate");
      if (bVar5) {
        sVar6 = (this->super_Parser).s.size;
        if (sVar6 != 0) {
          pbVar3 = (byte *)(this->super_Parser).s.s;
          do {
            sVar6 = sVar6 - 1;
            pcVar4 = (this->super_Parser).s.s;
            local_a8.size = (this->super_Parser).s.size;
            bVar1 = *pbVar3;
            (this->super_Parser).s.s = (char *)(pbVar3 + 1);
            (this->super_Parser).s.size = sVar6;
            if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
              (this->super_Parser).s.s = pcVar4;
              (this->super_Parser).s.size = local_a8.size;
              break;
            }
            pbVar3 = pbVar3 + 1;
          } while (sVar6 != 0);
        }
        local_a8.s = "(";
        local_a8.size = StringView::strlen((StringView *)"(",(char *)0x0);
        Parser::expect(&this->super_Parser,&local_a8);
        sVar6 = (this->super_Parser).s.size;
        if (sVar6 != 0) {
          pbVar3 = (byte *)(this->super_Parser).s.s;
          do {
            sVar6 = sVar6 - 1;
            local_a8.s = (this->super_Parser).s.s;
            local_a8.size = (this->super_Parser).s.size;
            bVar1 = *pbVar3;
            (this->super_Parser).s.s = (char *)(pbVar3 + 1);
            (this->super_Parser).s.size = sVar6;
            if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
              (this->super_Parser).s.s = local_a8.s;
              (this->super_Parser).s.size = local_a8.size;
              break;
            }
            pbVar3 = pbVar3 + 1;
          } while (sVar6 != 0);
        }
        local_8c = Parser::parse_number(&this->super_Parser);
        sVar6 = (this->super_Parser).s.size;
        if (sVar6 != 0) {
          pbVar3 = (byte *)(this->super_Parser).s.s;
          do {
            sVar6 = sVar6 - 1;
            local_a8.s = (this->super_Parser).s.s;
            local_a8.size = (this->super_Parser).s.size;
            bVar1 = *pbVar3;
            (this->super_Parser).s.s = (char *)(pbVar3 + 1);
            (this->super_Parser).s.size = sVar6;
            if ((bVar1 != 0x2c) && ((bVar1 < 0x21 & (byte)(0x100002600 >> (bVar1 & 0x3f))) == 0)) {
              (this->super_Parser).s.s = local_a8.s;
              (this->super_Parser).s.size = local_a8.size;
              break;
            }
            pbVar3 = pbVar3 + 1;
          } while (sVar6 != 0);
        }
        fVar8 = 0.0;
        if (((this->super_Parser).s.size != 0) &&
           (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10)) {
          fVar8 = Parser::parse_number(&this->super_Parser);
          sVar6 = (this->super_Parser).s.size;
          if (sVar6 != 0) {
            pbVar3 = (byte *)(this->super_Parser).s.s;
            do {
              sVar6 = sVar6 - 1;
              pcVar4 = (this->super_Parser).s.s;
              local_a8.size = (this->super_Parser).s.size;
              bVar1 = *pbVar3;
              (this->super_Parser).s.s = (char *)(pbVar3 + 1);
              (this->super_Parser).s.size = sVar6;
              if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                (this->super_Parser).s.s = pcVar4;
                (this->super_Parser).s.size = local_a8.size;
                break;
              }
              pbVar3 = pbVar3 + 1;
            } while (sVar6 != 0);
          }
        }
        local_a8.s = ")";
        local_78 = fVar8;
        local_a8.size = StringView::strlen((StringView *)0x111d87,(char *)0x0);
        Parser::expect(&this->super_Parser,&local_a8);
        fVar8 = __return_storage_ptr__->c;
        fVar10 = __return_storage_ptr__->a;
        fVar12 = __return_storage_ptr__->b;
        fVar14 = __return_storage_ptr__->d;
        fVar7 = fVar10 * local_8c + fVar8 * local_78 + __return_storage_ptr__->e;
        fVar9 = fVar12 * local_8c + local_78 * fVar14 + __return_storage_ptr__->f;
        __return_storage_ptr__->a = fVar8 * 0.0 + fVar10;
        __return_storage_ptr__->b = fVar14 * 0.0 + fVar12;
        __return_storage_ptr__->c = fVar10 * 0.0 + fVar8;
        __return_storage_ptr__->d = fVar12 * 0.0 + fVar14;
        goto LAB_00108539;
      }
      bVar5 = Parser::parse(&this->super_Parser,"scale");
      if (bVar5) {
        sVar6 = (this->super_Parser).s.size;
        if (sVar6 != 0) {
          pbVar3 = (byte *)(this->super_Parser).s.s;
          do {
            sVar6 = sVar6 - 1;
            pcVar4 = (this->super_Parser).s.s;
            local_a8.size = (this->super_Parser).s.size;
            bVar1 = *pbVar3;
            (this->super_Parser).s.s = (char *)(pbVar3 + 1);
            (this->super_Parser).s.size = sVar6;
            if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
              (this->super_Parser).s.s = pcVar4;
              (this->super_Parser).s.size = local_a8.size;
              break;
            }
            pbVar3 = pbVar3 + 1;
          } while (sVar6 != 0);
        }
        local_a8.s = "(";
        local_a8.size = StringView::strlen((StringView *)"(",(char *)0x0);
        Parser::expect(&this->super_Parser,&local_a8);
        sVar6 = (this->super_Parser).s.size;
        if (sVar6 != 0) {
          pbVar3 = (byte *)(this->super_Parser).s.s;
          do {
            sVar6 = sVar6 - 1;
            local_a8.s = (this->super_Parser).s.s;
            local_a8.size = (this->super_Parser).s.size;
            bVar1 = *pbVar3;
            (this->super_Parser).s.s = (char *)(pbVar3 + 1);
            (this->super_Parser).s.size = sVar6;
            if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
              (this->super_Parser).s.s = local_a8.s;
              (this->super_Parser).s.size = local_a8.size;
              break;
            }
            pbVar3 = pbVar3 + 1;
          } while (sVar6 != 0);
        }
        fVar8 = Parser::parse_number(&this->super_Parser);
        sVar6 = (this->super_Parser).s.size;
        if (sVar6 != 0) {
          pbVar3 = (byte *)(this->super_Parser).s.s;
          do {
            sVar6 = sVar6 - 1;
            local_a8.s = (this->super_Parser).s.s;
            local_a8.size = (this->super_Parser).s.size;
            bVar1 = *pbVar3;
            (this->super_Parser).s.s = (char *)(pbVar3 + 1);
            (this->super_Parser).s.size = sVar6;
            if ((bVar1 != 0x2c) && ((bVar1 < 0x21 & (byte)(0x100002600 >> (bVar1 & 0x3f))) == 0)) {
              (this->super_Parser).s.s = local_a8.s;
              (this->super_Parser).s.size = local_a8.size;
              break;
            }
            pbVar3 = pbVar3 + 1;
          } while (sVar6 != 0);
        }
        local_8c = fVar8;
        if (((this->super_Parser).s.size != 0) &&
           (cVar2 = *(this->super_Parser).s.s, cVar2 == '-' || (byte)(cVar2 - 0x30U) < 10)) {
          fVar8 = Parser::parse_number(&this->super_Parser);
          sVar6 = (this->super_Parser).s.size;
          if (sVar6 != 0) {
            pbVar3 = (byte *)(this->super_Parser).s.s;
            do {
              sVar6 = sVar6 - 1;
              pcVar4 = (this->super_Parser).s.s;
              local_a8.size = (this->super_Parser).s.size;
              bVar1 = *pbVar3;
              (this->super_Parser).s.s = (char *)(pbVar3 + 1);
              (this->super_Parser).s.size = sVar6;
              if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                (this->super_Parser).s.s = pcVar4;
                (this->super_Parser).s.size = local_a8.size;
                break;
              }
              pbVar3 = pbVar3 + 1;
            } while (sVar6 != 0);
          }
        }
        local_a8.s = ")";
        local_78 = fVar8;
        local_a8.size = StringView::strlen((StringView *)0x111d87,(char *)0x0);
        Parser::expect(&this->super_Parser,&local_a8);
        fVar12 = __return_storage_ptr__->c * 0.0;
        fVar14 = __return_storage_ptr__->d * 0.0;
        fVar8 = __return_storage_ptr__->a * 0.0;
        fVar10 = __return_storage_ptr__->b * 0.0;
        __return_storage_ptr__->a = __return_storage_ptr__->a * local_8c + fVar12;
        __return_storage_ptr__->b = local_8c * __return_storage_ptr__->b + fVar14;
        __return_storage_ptr__->c = __return_storage_ptr__->c * local_78 + fVar8;
        __return_storage_ptr__->d = local_78 * __return_storage_ptr__->d + fVar10;
        __return_storage_ptr__->e = fVar8 + fVar12 + __return_storage_ptr__->e;
        __return_storage_ptr__->f = fVar10 + fVar14 + __return_storage_ptr__->f;
      }
      else {
        bVar5 = Parser::parse(&this->super_Parser,"rotate");
        if (bVar5) {
          sVar6 = (this->super_Parser).s.size;
          if (sVar6 != 0) {
            pbVar3 = (byte *)(this->super_Parser).s.s;
            do {
              sVar6 = sVar6 - 1;
              pcVar4 = (this->super_Parser).s.s;
              local_a8.size = (this->super_Parser).s.size;
              bVar1 = *pbVar3;
              (this->super_Parser).s.s = (char *)(pbVar3 + 1);
              (this->super_Parser).s.size = sVar6;
              if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                (this->super_Parser).s.s = pcVar4;
                (this->super_Parser).s.size = local_a8.size;
                break;
              }
              pbVar3 = pbVar3 + 1;
            } while (sVar6 != 0);
          }
          local_a8.s = "(";
          local_a8.size = StringView::strlen((StringView *)"(",(char *)0x0);
          Parser::expect(&this->super_Parser,&local_a8);
          sVar6 = (this->super_Parser).s.size;
          if (sVar6 != 0) {
            pbVar3 = (byte *)(this->super_Parser).s.s;
            do {
              sVar6 = sVar6 - 1;
              local_a8.s = (this->super_Parser).s.s;
              local_a8.size = (this->super_Parser).s.size;
              bVar1 = *pbVar3;
              (this->super_Parser).s.s = (char *)(pbVar3 + 1);
              (this->super_Parser).s.size = sVar6;
              if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                (this->super_Parser).s.s = local_a8.s;
                (this->super_Parser).s.size = local_a8.size;
                break;
              }
              pbVar3 = pbVar3 + 1;
            } while (sVar6 != 0);
          }
          local_8c = Parser::parse_number(&this->super_Parser);
          local_8c = local_8c * 0.017453292;
          sVar6 = (this->super_Parser).s.size;
          if (sVar6 != 0) {
            pbVar3 = (byte *)(this->super_Parser).s.s;
            do {
              sVar6 = sVar6 - 1;
              local_a8.s = (this->super_Parser).s.s;
              local_a8.size = (this->super_Parser).s.size;
              bVar1 = *pbVar3;
              (this->super_Parser).s.s = (char *)(pbVar3 + 1);
              (this->super_Parser).s.size = sVar6;
              if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                (this->super_Parser).s.s = local_a8.s;
                (this->super_Parser).s.size = local_a8.size;
                break;
              }
              pbVar3 = pbVar3 + 1;
            } while (sVar6 != 0);
          }
          if (((this->super_Parser).s.size == 0) ||
             (cVar2 = *(this->super_Parser).s.s, cVar2 != '-' && 9 < (byte)(cVar2 - 0x30U))) {
            local_78 = cosf(local_8c);
            fVar7 = sinf(local_8c);
            fVar8 = __return_storage_ptr__->c;
            fVar10 = __return_storage_ptr__->a;
            fVar12 = __return_storage_ptr__->b;
            fVar9 = fVar10 * local_78 + fVar7 * fVar8;
            fVar14 = __return_storage_ptr__->d;
            fVar11 = fVar12 * local_78 + fVar7 * fVar14;
            fVar13 = local_78 * fVar8 - fVar10 * fVar7;
            fVar7 = local_78 * fVar14 - fVar7 * fVar12;
            fVar8 = fVar10 * 0.0 + fVar8 * 0.0 + __return_storage_ptr__->e;
            fVar10 = fVar12 * 0.0 + fVar14 * 0.0 + __return_storage_ptr__->f;
          }
          else {
            local_78 = Parser::parse_number(&this->super_Parser);
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8.s = (this->super_Parser).s.s;
                local_a8.size = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((bVar1 != 0x2c) && ((bVar1 < 0x21 & (byte)(0x100002600 >> (bVar1 & 0x3f))) == 0)
                   ) {
                  (this->super_Parser).s.s = local_a8.s;
                  (this->super_Parser).s.size = local_a8.size;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar6 != 0);
            }
            local_7c = Parser::parse_number(&this->super_Parser);
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8.s = (this->super_Parser).s.s;
                local_a8.size = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = local_a8.s;
                  (this->super_Parser).s.size = local_a8.size;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar6 != 0);
            }
            fVar8 = __return_storage_ptr__->c;
            fVar10 = __return_storage_ptr__->a;
            fVar12 = __return_storage_ptr__->b;
            local_54 = fVar8 * 0.0 + fVar10;
            fVar14 = __return_storage_ptr__->d;
            local_88 = fVar14 * 0.0 + fVar12;
            local_5c = fVar10 * 0.0 + fVar8;
            local_58 = fVar12 * 0.0 + fVar14;
            local_84 = fVar10 * local_78 + fVar8 * local_7c + __return_storage_ptr__->e;
            local_80 = fVar12 * local_78 + fVar14 * local_7c + __return_storage_ptr__->f;
            local_60 = cosf(local_8c);
            fVar8 = sinf(local_8c);
            fVar10 = local_54 * local_60 + local_5c * fVar8;
            fVar12 = local_88 * local_60 + local_58 * fVar8;
            fVar14 = local_5c * local_60 - local_54 * fVar8;
            fVar15 = local_60 * local_58 - fVar8 * local_88;
            fVar9 = fVar14 * 0.0 + fVar10;
            fVar11 = fVar15 * 0.0 + fVar12;
            fVar13 = fVar10 * 0.0 + fVar14;
            fVar7 = fVar12 * 0.0 + fVar15;
            fVar8 = (fVar10 * -local_78 - fVar14 * local_7c) +
                    local_54 * 0.0 + local_5c * 0.0 + local_84;
            fVar10 = (-local_78 * fVar12 - fVar15 * local_7c) +
                     local_88 * 0.0 + local_58 * 0.0 + local_80;
          }
          __return_storage_ptr__->a = fVar9;
          __return_storage_ptr__->b = fVar11;
          __return_storage_ptr__->c = fVar13;
          __return_storage_ptr__->d = fVar7;
          __return_storage_ptr__->e = fVar8;
          __return_storage_ptr__->f = fVar10;
          local_a8.s = ")";
          local_a8.size = StringView::strlen((StringView *)0x111d87,(char *)0x0);
          Parser::expect(&this->super_Parser,&local_a8);
        }
        else {
          bVar5 = Parser::parse(&this->super_Parser,"skewX");
          if (bVar5) {
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                pcVar4 = (this->super_Parser).s.s;
                local_a8.size = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = pcVar4;
                  (this->super_Parser).s.size = local_a8.size;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar6 != 0);
            }
            local_a8.s = "(";
            local_a8.size = StringView::strlen((StringView *)"(",(char *)0x0);
            Parser::expect(&this->super_Parser,&local_a8);
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8.s = (this->super_Parser).s.s;
                local_a8.size = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = local_a8.s;
                  (this->super_Parser).s.size = local_a8.size;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar6 != 0);
            }
            local_8c = Parser::parse_number(&this->super_Parser);
            local_8c = local_8c * 0.017453292;
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                pcVar4 = (this->super_Parser).s.s;
                local_a8.size = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = pcVar4;
                  (this->super_Parser).s.size = local_a8.size;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar6 != 0);
            }
            local_a8.s = ")";
            local_a8.size = StringView::strlen((StringView *)0x111d87,(char *)0x0);
            Parser::expect(&this->super_Parser,&local_a8);
            fVar12 = tanf(local_8c);
            fVar8 = __return_storage_ptr__->a;
            fVar14 = __return_storage_ptr__->c * 0.0;
            fVar10 = __return_storage_ptr__->b;
            fVar7 = __return_storage_ptr__->d * 0.0;
            __return_storage_ptr__->a = fVar8 + fVar14;
            __return_storage_ptr__->b = fVar10 + fVar7;
            __return_storage_ptr__->c = fVar8 * fVar12 + __return_storage_ptr__->c;
            __return_storage_ptr__->d = fVar12 * fVar10 + __return_storage_ptr__->d;
            __return_storage_ptr__->e = fVar8 * 0.0 + fVar14 + __return_storage_ptr__->e;
            __return_storage_ptr__->f = fVar10 * 0.0 + fVar7 + __return_storage_ptr__->f;
          }
          else {
            bVar5 = Parser::parse(&this->super_Parser,"skewY");
            if (!bVar5) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"unexpected transformation","");
              Parser::error(&this->super_Parser,&local_50);
            }
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                pcVar4 = (this->super_Parser).s.s;
                local_a8.size = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = pcVar4;
                  (this->super_Parser).s.size = local_a8.size;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar6 != 0);
            }
            local_a8.s = "(";
            local_a8.size = StringView::strlen((StringView *)"(",(char *)0x0);
            Parser::expect(&this->super_Parser,&local_a8);
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                local_a8.s = (this->super_Parser).s.s;
                local_a8.size = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = local_a8.s;
                  (this->super_Parser).s.size = local_a8.size;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar6 != 0);
            }
            local_8c = Parser::parse_number(&this->super_Parser);
            local_8c = local_8c * 0.017453292;
            sVar6 = (this->super_Parser).s.size;
            if (sVar6 != 0) {
              pbVar3 = (byte *)(this->super_Parser).s.s;
              do {
                sVar6 = sVar6 - 1;
                pcVar4 = (this->super_Parser).s.s;
                local_a8.size = (this->super_Parser).s.size;
                bVar1 = *pbVar3;
                (this->super_Parser).s.s = (char *)(pbVar3 + 1);
                (this->super_Parser).s.size = sVar6;
                if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
                  (this->super_Parser).s.s = pcVar4;
                  (this->super_Parser).s.size = local_a8.size;
                  break;
                }
                pbVar3 = pbVar3 + 1;
              } while (sVar6 != 0);
            }
            local_a8.s = ")";
            local_a8.size = StringView::strlen((StringView *)0x111d87,(char *)0x0);
            Parser::expect(&this->super_Parser,&local_a8);
            fVar12 = tanf(local_8c);
            fVar8 = __return_storage_ptr__->c;
            fVar10 = __return_storage_ptr__->d;
            fVar14 = __return_storage_ptr__->a * 0.0;
            fVar7 = __return_storage_ptr__->b * 0.0;
            __return_storage_ptr__->a = fVar12 * fVar8 + __return_storage_ptr__->a;
            __return_storage_ptr__->b = fVar12 * fVar10 + __return_storage_ptr__->b;
            __return_storage_ptr__->c = fVar14 + fVar8;
            __return_storage_ptr__->d = fVar7 + fVar10;
            __return_storage_ptr__->e = fVar8 * 0.0 + fVar14 + __return_storage_ptr__->e;
            __return_storage_ptr__->f = fVar10 * 0.0 + fVar7 + __return_storage_ptr__->f;
          }
        }
      }
    }
    sVar6 = (this->super_Parser).s.size;
    if (sVar6 != 0) {
      pbVar3 = (byte *)(this->super_Parser).s.s;
      do {
        sVar6 = sVar6 - 1;
        local_a8.s = (this->super_Parser).s.s;
        local_a8.size = (this->super_Parser).s.size;
        bVar1 = *pbVar3;
        (this->super_Parser).s.s = (char *)(pbVar3 + 1);
        (this->super_Parser).s.size = sVar6;
        if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          (this->super_Parser).s.s = local_a8.s;
          (this->super_Parser).s.size = local_a8.size;
          break;
        }
        pbVar3 = pbVar3 + 1;
      } while (sVar6 != 0);
    }
    sVar6 = (this->super_Parser).s.size;
  } while( true );
}

Assistant:

Transformation parse() {
		Transformation t;
		parse_all(white_space);
		while (has_next()) {
			if (parse("matrix")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number();
				parse_all(white_space_or_comma);
				const float b = parse_number();
				parse_all(white_space_or_comma);
				const float c = parse_number();
				parse_all(white_space_or_comma);
				const float d = parse_number();
				parse_all(white_space_or_comma);
				const float e = parse_number();
				parse_all(white_space_or_comma);
				const float f = parse_number();
				parse_all(white_space);
				expect(")");
				t = t * Transformation(a, b, c, d, e, f);
			}
			else if (parse("translate")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float x = parse_number();
				parse_all(white_space_or_comma);
				float y = 0.f;
				if (copy().parse(number_start_char)) {
					y = parse_number();
					parse_all(white_space);
				}
				expect(")");
				t = t * Transformation::translate(x, y);
			}
			else if (parse("scale")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float x = parse_number();
				parse_all(white_space_or_comma);
				float y = x;
				if (copy().parse(number_start_char)) {
					y = parse_number();
					parse_all(white_space);
				}
				expect(")");
				t = t * Transformation::scale(x, y);
			}
			else if (parse("rotate")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number() * (M_PI / 180.f);
				parse_all(white_space);
				if (copy().parse(number_start_char)) {
					const float x = parse_number();
					parse_all(white_space_or_comma);
					const float y = parse_number();
					parse_all(white_space);
					t = t * Transformation::translate(x, y) * Transformation::rotate(a) * Transformation::translate(-x, -y);
				}
				else {
					t = t * Transformation::rotate(a);
				}
				expect(")");
			}
			else if (parse("skewX")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number() * (M_PI / 180.f);
				parse_all(white_space);
				expect(")");
				t = t * Transformation(1.f, 0.f, std::tan(a), 1.f, 0.f, 0.f);
			}
			else if (parse("skewY")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number() * (M_PI / 180.f);
				parse_all(white_space);
				expect(")");
				t = t * Transformation(1.f, std::tan(a), 0.f, 1.f, 0.f, 0.f);
			}
			else {
				error("unexpected transformation");
			}
			parse_all(white_space);
		}
		return t;
	}